

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O2

JsErrorCode
JsCreateTracedExternalObject
          (void *data,size_t inlineSlotSize,JsTraceCallback traceCallback,
          JsFinalizeCallback finalizeCallback,JsValueRef prototype,JsValueRef *object)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  JsErrorCode exitStatus;
  BOOL BVar2;
  JsrtContext *currentContext;
  RecyclableObject *pRVar3;
  JsrtExternalObject *pJVar4;
  AutoNestedHandledExceptionType local_98 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_48 [8];
  TTDRecorder _actionEntryPopper;
  
  auStack_48 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  currentContext = JsrtContext::GetCurrent();
  exitStatus = CheckContext(currentContext,false,false);
  if (exitStatus != JsNoError) goto LAB_003b348d;
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_98,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTAllocateExternalObject
              (scriptContext->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_48,
               prototype);
  }
  if (object == (JsValueRef *)0x0) {
    exitStatus = JsErrorNullArgument;
  }
  else {
    if (prototype == (JsValueRef)0x0) {
      pRVar3 = (RecyclableObject *)0x0;
    }
    else {
      BVar2 = Js::JavascriptOperators::IsObjectOrNull(prototype);
      if (BVar2 == 0) {
        exitStatus = JsErrorArgumentNotObject;
        goto LAB_003b3481;
      }
      pRVar3 = Js::VarTo<Js::RecyclableObject>(prototype);
      pSVar1 = (((((pRVar3->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        exitStatus = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003b3481;
        prototype = Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
      }
      pRVar3 = Js::VarTo<Js::RecyclableObject>(prototype);
    }
    exitStatus = JsErrorInvalidArgument;
    if (inlineSlotSize >> 0x20 == 0) {
      pJVar4 = JsrtExternalObject::Create
                         (data,(uint)inlineSlotSize,traceCallback,finalizeCallback,pRVar3,
                          scriptContext,(JsrtExternalType *)0x0);
      *object = pJVar4;
      exitStatus = JsNoError;
      if (scriptContext->TTDShouldPerformRecordAction == true) {
        TTD::TTDJsRTActionResultAutoRecorder::SetResult
                  ((TTDJsRTActionResultAutoRecorder *)auStack_48,object);
      }
    }
  }
LAB_003b3481:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_98);
LAB_003b348d:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)auStack_48,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsCreateTracedExternalObject(
    _In_opt_ void *data,
    _In_opt_ size_t inlineSlotSize,
    _In_opt_ JsTraceCallback traceCallback,
    _In_opt_ JsFinalizeCallback finalizeCallback,
    _In_opt_ JsValueRef prototype,
    _Out_ JsValueRef *object)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTAllocateExternalObject, prototype);

        PARAM_NOT_NULL(object);

        Js::RecyclableObject * prototypeObject = nullptr;
        if (prototype != JS_INVALID_REFERENCE)
        {
            VALIDATE_INCOMING_OBJECT_OR_NULL(prototype, scriptContext);
            prototypeObject = Js::VarTo<Js::RecyclableObject>(prototype);
        }
        if (inlineSlotSize > UINT32_MAX)
        {
            return JsErrorInvalidArgument;
        }
        *object = JsrtExternalObject::Create(data, (uint)inlineSlotSize, traceCallback, finalizeCallback, prototypeObject, scriptContext, nullptr);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, object);

        return JsNoError;
    });
}